

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_analysis_simplification.cpp
# Opt level: O2

SENode * __thiscall
spvtools::opt::SENodeSimplifyImpl::FoldRecurrentAddExpressions
          (SENodeSimplifyImpl *this,SENode *root)

{
  ScalarEvolutionAnalysis *pSVar1;
  pointer ppSVar2;
  uint32_t uVar3;
  Loop *pLVar4;
  pointer ppVar5;
  bool bVar6;
  int iVar7;
  SENode *pSVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  iterator iVar9;
  vector<std::pair<spvtools::opt::SERecurrentNode*,bool>,std::allocator<std::pair<spvtools::opt::SERecurrentNode*,bool>>>
  *pvVar10;
  SENode *pSVar11;
  SENode *node_00;
  SENode *pSVar12;
  SERecurrentNode *pSVar13;
  SENode *child;
  undefined4 extraout_var_01;
  _Rb_tree_node_base *p_Var14;
  SERecurrentNode *node;
  pointer ppSVar15;
  pointer ppVar16;
  bool bVar17;
  SENode *local_b0;
  _Head_base<0UL,_spvtools::opt::SENode_*,_false> local_a0;
  pair<const_spvtools::opt::Loop_*const,_std::vector<std::pair<spvtools::opt::SERecurrentNode_*,_bool>,_std::allocator<std::pair<spvtools::opt::SERecurrentNode_*,_bool>_>_>_>
  pair;
  _Head_base<0UL,_spvtools::opt::SENode_*,_false> local_78;
  Loop *loop;
  _Rb_tree<const_spvtools::opt::Loop_*,_std::pair<const_spvtools::opt::Loop_*const,_std::vector<std::pair<spvtools::opt::SERecurrentNode_*,_bool>,_std::allocator<std::pair<spvtools::opt::SERecurrentNode_*,_bool>_>_>_>,_std::_Select1st<std::pair<const_spvtools::opt::Loop_*const,_std::vector<std::pair<spvtools::opt::SERecurrentNode_*,_bool>,_std::allocator<std::pair<spvtools::opt::SERecurrentNode_*,_bool>_>_>_>_>,_std::less<const_spvtools::opt::Loop_*>,_std::allocator<std::pair<const_spvtools::opt::Loop_*const,_std::vector<std::pair<spvtools::opt::SERecurrentNode_*,_bool>,_std::allocator<std::pair<spvtools::opt::SERecurrentNode_*,_bool>_>_>_>_>_>
  local_68;
  
  pSVar8 = (SENode *)::operator_new(0x30);
  pSVar1 = this->analysis_;
  (pSVar8->children_).
  super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pSVar8->children_).
  super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pSVar8->children_).
  super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pSVar8->parent_analysis_ = pSVar1;
  SENode::NumberOfNodes = SENode::NumberOfNodes + 1;
  pSVar8->unique_id_ = SENode::NumberOfNodes;
  local_68._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_68._M_impl.super__Rb_tree_header._M_header;
  local_68._M_impl._0_8_ = 0;
  local_68._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_68._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_68._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_68._M_impl.super__Rb_tree_header._M_node_count = 0;
  pSVar8->_vptr_SENode = (_func_int **)&PTR_GetType_00a71208;
  ppSVar2 = (root->children_).
            super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  bVar6 = false;
  local_68._M_impl.super__Rb_tree_header._M_header._M_right =
       local_68._M_impl.super__Rb_tree_header._M_header._M_left;
  for (ppSVar15 = (root->children_).
                  super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>
                  ._M_impl.super__Vector_impl_data._M_start; ppSVar15 != ppSVar2;
      ppSVar15 = ppSVar15 + 1) {
    pSVar11 = *ppSVar15;
    iVar7 = (**pSVar11->_vptr_SENode)(pSVar11);
    bVar17 = iVar7 == 4;
    if (bVar17) {
      pSVar11 = *(pSVar11->children_).
                 super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
    }
    iVar7 = (**pSVar11->_vptr_SENode)(pSVar11);
    if (iVar7 == 1) {
      iVar7 = (*pSVar11->_vptr_SENode[6])(pSVar11);
      loop = *(Loop **)(CONCAT44(extraout_var,iVar7) + 0x40);
      iVar7 = (*pSVar11->_vptr_SENode[6])(pSVar11);
      iVar9 = std::
              _Rb_tree<const_spvtools::opt::Loop_*,_std::pair<const_spvtools::opt::Loop_*const,_std::vector<std::pair<spvtools::opt::SERecurrentNode_*,_bool>,_std::allocator<std::pair<spvtools::opt::SERecurrentNode_*,_bool>_>_>_>,_std::_Select1st<std::pair<const_spvtools::opt::Loop_*const,_std::vector<std::pair<spvtools::opt::SERecurrentNode_*,_bool>,_std::allocator<std::pair<spvtools::opt::SERecurrentNode_*,_bool>_>_>_>_>,_std::less<const_spvtools::opt::Loop_*>,_std::allocator<std::pair<const_spvtools::opt::Loop_*const,_std::vector<std::pair<spvtools::opt::SERecurrentNode_*,_bool>,_std::allocator<std::pair<spvtools::opt::SERecurrentNode_*,_bool>_>_>_>_>_>
              ::find(&local_68,&loop);
      if ((_Rb_tree_header *)iVar9._M_node == &local_68._M_impl.super__Rb_tree_header) {
        pair.first = (Loop *)CONCAT44(extraout_var_00,iVar7);
        pair.second.
        super__Vector_base<std::pair<spvtools::opt::SERecurrentNode_*,_bool>,_std::allocator<std::pair<spvtools::opt::SERecurrentNode_*,_bool>_>_>
        ._M_impl.super__Vector_impl_data._M_start._0_1_ = bVar17;
        pvVar10 = (vector<std::pair<spvtools::opt::SERecurrentNode*,bool>,std::allocator<std::pair<spvtools::opt::SERecurrentNode*,bool>>>
                   *)std::
                     map<const_spvtools::opt::Loop_*,_std::vector<std::pair<spvtools::opt::SERecurrentNode_*,_bool>,_std::allocator<std::pair<spvtools::opt::SERecurrentNode_*,_bool>_>_>,_std::less<const_spvtools::opt::Loop_*>,_std::allocator<std::pair<const_spvtools::opt::Loop_*const,_std::vector<std::pair<spvtools::opt::SERecurrentNode_*,_bool>,_std::allocator<std::pair<spvtools::opt::SERecurrentNode_*,_bool>_>_>_>_>_>
                     ::operator[]((map<const_spvtools::opt::Loop_*,_std::vector<std::pair<spvtools::opt::SERecurrentNode_*,_bool>,_std::allocator<std::pair<spvtools::opt::SERecurrentNode_*,_bool>_>_>,_std::less<const_spvtools::opt::Loop_*>,_std::allocator<std::pair<const_spvtools::opt::Loop_*const,_std::vector<std::pair<spvtools::opt::SERecurrentNode_*,_bool>,_std::allocator<std::pair<spvtools::opt::SERecurrentNode_*,_bool>_>_>_>_>_>
                                   *)&local_68,&loop);
        std::
        vector<std::pair<spvtools::opt::SERecurrentNode*,bool>,std::allocator<std::pair<spvtools::opt::SERecurrentNode*,bool>>>
        ::_M_assign_aux<std::pair<spvtools::opt::SERecurrentNode*,bool>const*>
                  (pvVar10,&pair,
                   &pair.second.
                    super__Vector_base<std::pair<spvtools::opt::SERecurrentNode_*,_bool>,_std::allocator<std::pair<spvtools::opt::SERecurrentNode_*,_bool>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish);
      }
      else {
        pvVar10 = (vector<std::pair<spvtools::opt::SERecurrentNode*,bool>,std::allocator<std::pair<spvtools::opt::SERecurrentNode*,bool>>>
                   *)std::
                     map<const_spvtools::opt::Loop_*,_std::vector<std::pair<spvtools::opt::SERecurrentNode_*,_bool>,_std::allocator<std::pair<spvtools::opt::SERecurrentNode_*,_bool>_>_>,_std::less<const_spvtools::opt::Loop_*>,_std::allocator<std::pair<const_spvtools::opt::Loop_*const,_std::vector<std::pair<spvtools::opt::SERecurrentNode_*,_bool>,_std::allocator<std::pair<spvtools::opt::SERecurrentNode_*,_bool>_>_>_>_>_>
                     ::operator[]((map<const_spvtools::opt::Loop_*,_std::vector<std::pair<spvtools::opt::SERecurrentNode_*,_bool>,_std::allocator<std::pair<spvtools::opt::SERecurrentNode_*,_bool>_>_>,_std::less<const_spvtools::opt::Loop_*>,_std::allocator<std::pair<const_spvtools::opt::Loop_*const,_std::vector<std::pair<spvtools::opt::SERecurrentNode_*,_bool>,_std::allocator<std::pair<spvtools::opt::SERecurrentNode_*,_bool>_>_>_>_>_>
                                   *)&local_68,&loop);
        pair.first = (Loop *)CONCAT44(extraout_var_00,iVar7);
        pair.second.
        super__Vector_base<std::pair<spvtools::opt::SERecurrentNode_*,_bool>,_std::allocator<std::pair<spvtools::opt::SERecurrentNode_*,_bool>_>_>
        ._M_impl.super__Vector_impl_data._M_start._0_1_ = bVar17;
        std::
        vector<std::pair<spvtools::opt::SERecurrentNode*,bool>,std::allocator<std::pair<spvtools::opt::SERecurrentNode*,bool>>>
        ::emplace_back<std::pair<spvtools::opt::SERecurrentNode*,bool>>
                  (pvVar10,(pair<spvtools::opt::SERecurrentNode_*,_bool> *)&pair);
        bVar6 = true;
      }
    }
    else {
      (*pSVar8->_vptr_SENode[3])(pSVar8,pSVar11);
    }
  }
  p_Var14 = local_68._M_impl.super__Rb_tree_header._M_header._M_left;
  local_b0 = root;
  if (bVar6) {
    for (; (_Rb_tree_header *)p_Var14 != &local_68._M_impl.super__Rb_tree_header;
        p_Var14 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var14)) {
      std::
      pair<const_spvtools::opt::Loop_*const,_std::vector<std::pair<spvtools::opt::SERecurrentNode_*,_bool>,_std::allocator<std::pair<spvtools::opt::SERecurrentNode_*,_bool>_>_>_>
      ::pair(&pair,(pair<const_spvtools::opt::Loop_*const,_std::vector<std::pair<spvtools::opt::SERecurrentNode_*,_bool>,_std::allocator<std::pair<spvtools::opt::SERecurrentNode_*,_bool>_>_>_>
                    *)(p_Var14 + 1));
      pLVar4 = pair.first;
      pSVar11 = (SENode *)::operator_new(0x30);
      pSVar1 = this->analysis_;
      (pSVar11->children_).
      super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (pSVar11->children_).
      super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (pSVar11->children_).
      super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pSVar11->parent_analysis_ = pSVar1;
      uVar3 = SENode::NumberOfNodes;
      pSVar11->unique_id_ = SENode::NumberOfNodes + 1;
      pSVar11->_vptr_SENode = (_func_int **)&PTR_GetType_00a71208;
      node_00 = (SENode *)::operator_new(0x30);
      ppVar5 = pair.second.
               super__Vector_base<std::pair<spvtools::opt::SERecurrentNode_*,_bool>,_std::allocator<std::pair<spvtools::opt::SERecurrentNode_*,_bool>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      (node_00->children_).
      super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (node_00->children_).
      super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (node_00->children_).
      super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      node_00->parent_analysis_ = pSVar1;
      SENode::NumberOfNodes = uVar3 + 2;
      node_00->unique_id_ = SENode::NumberOfNodes;
      node_00->_vptr_SENode = (_func_int **)&PTR_GetType_00a71208;
      for (ppVar16 = (pointer)CONCAT71(pair.second.
                                       super__Vector_base<std::pair<spvtools::opt::SERecurrentNode_*,_bool>,_std::allocator<std::pair<spvtools::opt::SERecurrentNode_*,_bool>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                       pair.second.
                                       super__Vector_base<std::pair<spvtools::opt::SERecurrentNode_*,_bool>,_std::allocator<std::pair<spvtools::opt::SERecurrentNode_*,_bool>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start._0_1_);
          ppVar16 != ppVar5; ppVar16 = ppVar16 + 1) {
        pSVar13 = ppVar16->first;
        if ((ppVar16->second & 1U) == 0) {
          (*pSVar11->_vptr_SENode[3])(pSVar11,pSVar13->coefficient_);
          pSVar12 = pSVar13->offset_;
        }
        else {
          pSVar12 = ScalarEvolutionAnalysis::CreateNegation(this->analysis_,pSVar13->coefficient_);
          (*pSVar11->_vptr_SENode[3])(pSVar11,pSVar12);
          pSVar12 = ScalarEvolutionAnalysis::CreateNegation(this->analysis_,pSVar13->offset_);
        }
        (*node_00->_vptr_SENode[3])(node_00,pSVar12);
      }
      pSVar13 = (SERecurrentNode *)::operator_new(0x48);
      pSVar1 = this->analysis_;
      (pSVar13->super_SENode).children_.
      super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (pSVar13->super_SENode).children_.
      super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (pSVar13->super_SENode).children_.
      super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (pSVar13->super_SENode).parent_analysis_ = pSVar1;
      SENode::NumberOfNodes = SENode::NumberOfNodes + 1;
      (pSVar13->super_SENode).unique_id_ = SENode::NumberOfNodes;
      (pSVar13->super_SENode)._vptr_SENode = (_func_int **)&PTR_GetType_00a71098;
      pSVar13->loop_ = pLVar4;
      pSVar12 = ScalarEvolutionAnalysis::SimplifyExpression(pSVar1,pSVar11);
      child = ScalarEvolutionAnalysis::SimplifyExpression(this->analysis_,node_00);
      iVar7 = (**pSVar12->_vptr_SENode)(pSVar12);
      if ((iVar7 == 0) &&
         (iVar7 = (*pSVar12->_vptr_SENode[4])(pSVar12),
         *(long *)(CONCAT44(extraout_var_01,iVar7) + 0x30) == 0)) {
        (*(pSVar13->super_SENode)._vptr_SENode[2])(pSVar13);
        bVar6 = false;
        local_b0 = child;
      }
      else {
        SERecurrentNode::AddCoefficient(pSVar13,pSVar12);
        SERecurrentNode::AddOffset(pSVar13,child);
        local_a0._M_head_impl = (SENode *)pSVar13;
        pSVar12 = ScalarEvolutionAnalysis::GetCachedOrAdd
                            (this->analysis_,
                             (unique_ptr<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_>
                              *)&local_a0);
        (*pSVar8->_vptr_SENode[3])(pSVar8,pSVar12);
        if ((SERecurrentNode *)local_a0._M_head_impl != (SERecurrentNode *)0x0) {
          (*((SENode *)&(local_a0._M_head_impl)->_vptr_SENode)->_vptr_SENode[2])();
        }
        local_a0._M_head_impl = (SENode *)0x0;
        bVar6 = true;
      }
      (*node_00->_vptr_SENode[2])(node_00);
      (*pSVar11->_vptr_SENode[2])(pSVar11);
      std::
      _Vector_base<std::pair<spvtools::opt::SERecurrentNode_*,_bool>,_std::allocator<std::pair<spvtools::opt::SERecurrentNode_*,_bool>_>_>
      ::~_Vector_base(&pair.second.
                       super__Vector_base<std::pair<spvtools::opt::SERecurrentNode_*,_bool>,_std::allocator<std::pair<spvtools::opt::SERecurrentNode_*,_bool>_>_>
                     );
      root = local_b0;
      if (!bVar6) goto LAB_004fdb6e;
    }
    ppSVar15 = (pSVar8->children_).
               super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    if ((long)(pSVar8->children_).
              super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>.
              _M_impl.super__Vector_impl_data._M_finish - (long)ppSVar15 == 8) {
      root = *ppSVar15;
    }
    else {
      local_78._M_head_impl = pSVar8;
      root = ScalarEvolutionAnalysis::GetCachedOrAdd
                       (this->analysis_,
                        (unique_ptr<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_>
                         *)&local_78);
      if (local_78._M_head_impl != (SENode *)0x0) {
        (*(local_78._M_head_impl)->_vptr_SENode[2])();
      }
      local_78._M_head_impl = (SENode *)0x0;
      pSVar8 = (SENode *)0x0;
    }
  }
LAB_004fdb6e:
  std::
  _Rb_tree<const_spvtools::opt::Loop_*,_std::pair<const_spvtools::opt::Loop_*const,_std::vector<std::pair<spvtools::opt::SERecurrentNode_*,_bool>,_std::allocator<std::pair<spvtools::opt::SERecurrentNode_*,_bool>_>_>_>,_std::_Select1st<std::pair<const_spvtools::opt::Loop_*const,_std::vector<std::pair<spvtools::opt::SERecurrentNode_*,_bool>,_std::allocator<std::pair<spvtools::opt::SERecurrentNode_*,_bool>_>_>_>_>,_std::less<const_spvtools::opt::Loop_*>,_std::allocator<std::pair<const_spvtools::opt::Loop_*const,_std::vector<std::pair<spvtools::opt::SERecurrentNode_*,_bool>,_std::allocator<std::pair<spvtools::opt::SERecurrentNode_*,_bool>_>_>_>_>_>
  ::~_Rb_tree(&local_68);
  if (pSVar8 != (SENode *)0x0) {
    (*pSVar8->_vptr_SENode[2])(pSVar8);
  }
  return root;
}

Assistant:

SENode* SENodeSimplifyImpl::FoldRecurrentAddExpressions(SENode* root) {
  std::unique_ptr<SEAddNode> new_node{new SEAddNode(&analysis_)};

  // A mapping of loops to the list of recurrent expressions which are with
  // respect to those loops.
  std::map<const Loop*, std::vector<std::pair<SERecurrentNode*, bool>>>
      loops_to_recurrent{};

  bool has_multiple_same_loop_recurrent_terms = false;

  for (SENode* child : *root) {
    bool negation = false;

    if (child->GetType() == SENode::Negative) {
      child = child->GetChild(0);
      negation = true;
    }

    if (child->GetType() == SENode::RecurrentAddExpr) {
      const Loop* loop = child->AsSERecurrentNode()->GetLoop();

      SERecurrentNode* rec = child->AsSERecurrentNode();
      if (loops_to_recurrent.find(loop) == loops_to_recurrent.end()) {
        loops_to_recurrent[loop] = {std::make_pair(rec, negation)};
      } else {
        loops_to_recurrent[loop].push_back(std::make_pair(rec, negation));
        has_multiple_same_loop_recurrent_terms = true;
      }
    } else {
      new_node->AddChild(child);
    }
  }

  if (!has_multiple_same_loop_recurrent_terms) return root;

  for (auto pair : loops_to_recurrent) {
    std::vector<std::pair<SERecurrentNode*, bool>>& recurrent_expressions =
        pair.second;
    const Loop* loop = pair.first;

    std::unique_ptr<SENode> new_coefficient{new SEAddNode(&analysis_)};
    std::unique_ptr<SENode> new_offset{new SEAddNode(&analysis_)};

    for (auto node_pair : recurrent_expressions) {
      SERecurrentNode* node = node_pair.first;
      bool negative = node_pair.second;

      if (!negative) {
        new_coefficient->AddChild(node->GetCoefficient());
        new_offset->AddChild(node->GetOffset());
      } else {
        new_coefficient->AddChild(
            analysis_.CreateNegation(node->GetCoefficient()));
        new_offset->AddChild(analysis_.CreateNegation(node->GetOffset()));
      }
    }

    std::unique_ptr<SERecurrentNode> new_recurrent{
        new SERecurrentNode(&analysis_, loop)};

    SENode* new_coefficient_simplified =
        analysis_.SimplifyExpression(new_coefficient.get());

    SENode* new_offset_simplified =
        analysis_.SimplifyExpression(new_offset.get());

    if (new_coefficient_simplified->GetType() == SENode::Constant &&
        new_coefficient_simplified->AsSEConstantNode()->FoldToSingleValue() ==
            0) {
      return new_offset_simplified;
    }

    new_recurrent->AddCoefficient(new_coefficient_simplified);
    new_recurrent->AddOffset(new_offset_simplified);

    new_node->AddChild(analysis_.GetCachedOrAdd(std::move(new_recurrent)));
  }

  // If we only have one child in the add just return that.
  if (new_node->GetChildren().size() == 1) {
    return new_node->GetChild(0);
  }

  return analysis_.GetCachedOrAdd(std::move(new_node));
}